

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_sender.c
# Opt level: O2

void remove_pending_message_by_index(MESSAGE_SENDER_HANDLE message_sender,size_t index)

{
  ASYNC_OPERATION_HANDLE *ppAVar1;
  ulong uVar2;
  ASYNC_OPERATION_HANDLE async_operation;
  size_t sVar3;
  
  async_operation = message_sender->messages[index];
  if ((MESSAGE_HANDLE)async_operation[1].async_operation_cancel_handler != (MESSAGE_HANDLE)0x0) {
    message_destroy((MESSAGE_HANDLE)async_operation[1].async_operation_cancel_handler);
    async_operation[1].async_operation_cancel_handler = (ASYNC_OPERATION_CANCEL_HANDLER_FUNC)0x0;
    async_operation = message_sender->messages[index];
  }
  async_operation_destroy(async_operation);
  sVar3 = message_sender->message_count;
  if (1 < sVar3 - index) {
    memmove(message_sender->messages + index,message_sender->messages + index + 1,
            (sVar3 - index) * 8 - 8);
    sVar3 = message_sender->message_count;
  }
  uVar2 = sVar3 - 1;
  message_sender->message_count = uVar2;
  if (uVar2 == 0) {
    free(message_sender->messages);
    ppAVar1 = (ASYNC_OPERATION_HANDLE *)0x0;
  }
  else {
    if (uVar2 >> 0x3d != 0) {
      return;
    }
    ppAVar1 = (ASYNC_OPERATION_HANDLE *)realloc(message_sender->messages,uVar2 * 8);
    if (ppAVar1 == (ASYNC_OPERATION_HANDLE *)0x0) {
      return;
    }
  }
  message_sender->messages = ppAVar1;
  return;
}

Assistant:

static void remove_pending_message_by_index(MESSAGE_SENDER_HANDLE message_sender, size_t index)
{
    ASYNC_OPERATION_HANDLE* new_messages;
    MESSAGE_WITH_CALLBACK* message_with_callback = GET_ASYNC_OPERATION_CONTEXT(MESSAGE_WITH_CALLBACK, message_sender->messages[index]);

    if (message_with_callback->message != NULL)
    {
        message_destroy(message_with_callback->message);
        message_with_callback->message = NULL;
    }

    async_operation_destroy(message_sender->messages[index]);

    if (message_sender->message_count - index > 1)
    {
        (void)memmove(&message_sender->messages[index], &message_sender->messages[index + 1], sizeof(ASYNC_OPERATION_HANDLE) * (message_sender->message_count - index - 1));
    }

    message_sender->message_count--;

    if (message_sender->message_count > 0)
    {
        size_t realloc_size = safe_multiply_size_t(sizeof(ASYNC_OPERATION_HANDLE), (message_sender->message_count));
        if (realloc_size != SIZE_MAX &&
            (new_messages = (ASYNC_OPERATION_HANDLE*)realloc(message_sender->messages, realloc_size)) != NULL)
        {
            message_sender->messages = new_messages;
        }
    }
    else
    {
        free(message_sender->messages);
        message_sender->messages = NULL;
    }
}